

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt.h
# Opt level: O2

void __thiscall
mp::pre::ValuePresolverImpl::
WriteNodes<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>>
          (ValuePresolverImpl *this,
          MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *jw,
          vector<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_> *nodes)

{
  pointer pNVar1;
  Node *this_00;
  long lVar2;
  ulong uVar3;
  string_view key;
  string_view key_00;
  undefined8 local_68;
  int local_5c;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *local_58;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_50;
  Node jelement;
  
  lVar2 = 0xc;
  local_58 = jw;
  for (uVar3 = 0;
      pNVar1 = (nodes->super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(nodes->
                            super__Vector_base<mp::pre::NodeRange,_std::allocator<mp::pre::NodeRange>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4);
      uVar3 = uVar3 + 1) {
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator++(&jelement);
    if (*(int *)((long)pNVar1 + lVar2 + -4) == *(int *)((long)&pNVar1->pvn_ + lVar2) + -1) {
      local_68 = CONCAT44(local_68._4_4_,*(undefined4 *)((long)pNVar1 + lVar2 + -4));
      key._M_str = *(char **)(*(long *)((long)pNVar1 + lVar2 + -0xc) + 0x60);
      key._M_len = (size_t)&jelement;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_50,key);
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)&local_50,
                 (int *)&local_68);
    }
    else {
      key_00._M_str = *(char **)(*(long *)((long)pNVar1 + lVar2 + -0xc) + 0x60);
      key_00._M_len = (size_t)&jelement;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
                (&local_50,key_00);
      local_68 = *(undefined8 *)((long)pNVar1 + lVar2 + -4);
      this_00 = MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator<<
                          ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)
                           &local_50,(int *)&local_68);
      local_5c = *(int *)((long)&pNVar1->pvn_ + lVar2) + -1;
      MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator<<
                ((MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>> *)this_00,
                 &local_5c);
    }
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&local_50)
    ;
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter(&jelement)
    ;
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void WriteNodes(JSON jw, const std::vector<NodeRange>& nodes) {
    for (size_t i=0; i<nodes.size(); ++i) {
      const auto& nd = nodes[i];
      auto jelement = ++jw;       // jw is an array of dict's
      if (nd.IsSingleIndex())
        jelement[nd.GetValueNode()->GetName()] = (int)nd;
      else
        jelement[nd.GetValueNode()->GetName()]
            << nd.GetIndexRange().beg_
            << (nd.GetIndexRange().end_-1);  // print the exact last value
    }
  }